

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O2

int AF_A_CheckForReload(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  void *val;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  AWeapon *this_00;
  DObject *this_01;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_005c05a1;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005c0591;
  this_01 = (DObject *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this_01 == (DObject *)0x0) goto LAB_005c03c3;
    bVar2 = DObject::IsKindOf(this_01,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005c05a1;
    }
  }
  else {
    if (this_01 != (DObject *)0x0) goto LAB_005c0591;
LAB_005c03c3:
    this_01 = (DObject *)0x0;
  }
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_005c0591:
        pcVar4 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005c05a1;
      }
      this = (DObject *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if ((this != (DObject *)0x0) &&
           (bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar2)) {
          pcVar4 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005c05a1;
        }
      }
      else if (this != (DObject *)0x0) goto LAB_005c0591;
    }
    if (((2 < (uint)numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      pcVar4 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005c05a1:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x1206,
                    "int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((*(long *)&this_01[0xc].ObjectFlags == 0) ||
     (this_00 = *(AWeapon **)(*(long *)&this_01[0xc].ObjectFlags + 0xd0), this_00 == (AWeapon *)0x0)
     ) {
    if (numret < 1) {
      return 0;
    }
    if (ret != (VMReturn *)0x0) {
      VMReturn::SetPointer(ret,(void *)0x0,7);
      return 1;
    }
    __assert_fail("ret != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x120a,"int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  if ((uint)numparam < 4) {
    pcVar4 = "(paramnum) < numparam";
LAB_005c05d2:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x120c,"int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar4 = "param[paramnum].Type == REGT_INT";
    goto LAB_005c05d2;
  }
  if (numparam == 4) {
    pcVar4 = "(paramnum) < numparam";
LAB_005c05f1:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x120d,"int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  if ((param[4].field_0.field_3.Type != '\x03') ||
     (val = param[4].field_0.field_1.a, val != (void *)0x0 && param[4].field_0.field_1.atag != 7)) {
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
    ;
    goto LAB_005c05f1;
  }
  iVar3 = param[3].field_0.i;
  if ((uint)numparam < 6) {
LAB_005c04cb:
    bVar2 = false;
  }
  else {
    VVar1 = param[5].field_0.field_3.Type;
    if (VVar1 != '\0') {
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x120e,
                      "int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      goto LAB_005c04cb;
    }
    bVar2 = param[5].field_0.i != 0;
  }
  if (0 < numret) {
    VMReturn::SetPointer(ret,(void *)0x0,7);
    this_00 = *(AWeapon **)(*(long *)&this_01[0xc].ObjectFlags + 0xd0);
    numret = 1;
  }
  if ((bool)(bVar2 & this_00->ReloadCounter == 0)) {
    iVar3 = 1;
  }
  else {
    iVar3 = (this_00->ReloadCounter + 1) % iVar3;
    if (iVar3 == 0) {
      iVar3 = 0;
      AWeapon::CheckAmmo(this_00,0,false,false,-1);
      goto LAB_005c0574;
    }
  }
  if (numret != 0) {
    VMReturn::SetPointer(ret,val,7);
  }
LAB_005c0574:
  if (!bVar2) {
    this_00->ReloadCounter = iVar3;
  }
  return numret;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_CheckForReload)
{
	PARAM_ACTION_PROLOGUE;

	if ( self->player == NULL || self->player->ReadyWeapon == NULL )
	{
		ACTION_RETURN_STATE(NULL);
	}
	PARAM_INT		(count);
	PARAM_STATE		(jump);
	PARAM_BOOL_OPT	(dontincrement)		{ dontincrement = false; }

	if (numret > 0)
	{
		ret->SetPointer(NULL, ATAG_STATE);
		numret = 1;
	}

	AWeapon *weapon = self->player->ReadyWeapon;

	int ReloadCounter = weapon->ReloadCounter;
	if (!dontincrement || ReloadCounter != 0)
		ReloadCounter = (weapon->ReloadCounter+1) % count;
	else // 0 % 1 = 1?  So how do we check if the weapon was never fired?  We should only do this when we're not incrementing the counter though.
		ReloadCounter = 1;

	// If we have not made our last shot...
	if (ReloadCounter != 0)
	{
		// Go back to the refire frames, instead of continuing on to the reload frames.
		if (numret != 0)
		{
			ret->SetPointer(jump, ATAG_STATE);
		}
	}
	else
	{
		// We need to reload. However, don't reload if we're out of ammo.
		weapon->CheckAmmo(false, false);
	}
	if (!dontincrement)
	{
		weapon->ReloadCounter = ReloadCounter;
	}
	return numret;
}